

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

bool Path::get_mtime_us(string *path,uint64_t *mtime_us)

{
  int iVar1;
  char *__file;
  undefined1 local_b0 [8];
  stat s;
  uint64_t *mtime_us_local;
  string *path_local;
  
  s.__glibc_reserved[2] = (__syscall_slong_t)mtime_us;
  memset(local_b0,0,0x90);
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,(stat *)local_b0);
  if (iVar1 == 0) {
    *(__syscall_slong_t *)s.__glibc_reserved[2] =
         s.st_atim.tv_nsec * 1000000 + s.st_mtim.tv_sec / 1000;
  }
  return iVar1 == 0;
}

Assistant:

bool get_mtime_us(const std::string &path, uint64_t &mtime_us)
{
#ifdef _WIN32
	HANDLE h = CreateFileA(path.c_str(), GENERIC_READ, FILE_SHARE_READ,
	                       nullptr, OPEN_EXISTING, FILE_ATTRIBUTE_NORMAL,
	                       INVALID_HANDLE_VALUE);
	if (h == INVALID_HANDLE_VALUE)
		return false;

	FILETIME ft;
	if (!GetFileTime(h, nullptr, nullptr, &ft))
	{
		CloseHandle(h);
		return false;
	}

	mtime_us = ((uint64_t(ft.dwHighDateTime) << 32) | uint64_t(ft.dwLowDateTime)) / 10;
	CloseHandle(h);
	return true;
#else
	struct stat s = {};
	if (::stat(path.c_str(), &s) != 0)
		return false;
#if defined(__linux__)
	mtime_us = s.st_mtim.tv_sec * 1000000ll + s.st_mtim.tv_nsec / 1000;
#else
	// Fallback.
	mtime_us = s.st_mtime * 1000000ll;
#endif
	return true;
#endif
}